

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O0

void __thiscall
InterpreterTestSuite_PC_BrListNegative_Test::~InterpreterTestSuite_PC_BrListNegative_Test
          (InterpreterTestSuite_PC_BrListNegative_Test *this)

{
  InterpreterTestSuite_PC_BrListNegative_Test *this_local;
  
  InterpreterTestSuite::~InterpreterTestSuite(&this->super_InterpreterTestSuite);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_BrListNegative)
{
    TestContext ctx;
    InitContext(ctx);

    ASSERT_NE(ctx.mRegistry, nullptr);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net1", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0,
                                             "", 0, 0x1F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);
    ASSERT_EQ(ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20002, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                             "net2", 2, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain2", 0, 0,
                                             "", 0, 0x1F | BorderAgent::kDomainNameBit}),
              RegistryStatus::kSuccess);

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("br list --nwk net1 net3");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());

    expr  = ctx.mInterpreter.ParseExpression("br list --nwk net3");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_EQ(value.mError.GetCode(), ErrorCode::kRegistryError);

    expr  = ctx.mInterpreter.ParseExpression("br list --dom domain3");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_EQ(value.mError.GetCode(), ErrorCode::kRegistryError);
}